

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn<false>(boosting *o,single_learner *base,example *ec)

{
  EVP_PKEY_CTX *this;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *siglen;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  undefined4 extraout_XMM0_Da;
  int i;
  float u;
  float s;
  float final_prediction;
  label_data *ld;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  
  this = in_RDX + 0x6828;
  fVar4 = 0.0;
  uVar3 = 0;
  uVar2 = *(undefined4 *)(in_RDX + 0x6870);
  siglen = in_RDX;
  sig = in_RSI;
  ctx = in_RDI;
  for (iVar1 = 0; iVar1 < *(int *)in_RDI; iVar1 = iVar1 + 1) {
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)this,(example *)CONCAT44(fVar4,uVar3),CONCAT44(uVar2,iVar1)
              );
    fVar4 = *(float *)(in_RDX + 0x6850) + fVar4;
    siglen = extraout_RDX;
  }
  *(undefined4 *)(in_RDX + 0x6870) = uVar2;
  *(float *)(in_RDX + 0x68a8) = fVar4;
  sign(ctx,(uchar *)sig,(size_t *)siglen,(uchar *)in_RDI,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  if ((*(float *)this != *(float *)(in_RDX + 0x6850)) ||
     (NAN(*(float *)this) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}